

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

void __thiscall Generator::registerClassInfoStrings(Generator *this)

{
  ClassInfoDef *c;
  ClassInfoDef *s;
  long lVar1;
  
  s = (this->cdef->super_BaseDef).classInfoList.d.ptr;
  for (lVar1 = (this->cdef->super_BaseDef).classInfoList.d.size * 0x30; lVar1 != 0;
      lVar1 = lVar1 + -0x30) {
    strreg(this,&s->name);
    strreg(this,&s->value);
    s = s + 1;
  }
  return;
}

Assistant:

void Generator::registerClassInfoStrings()
{
    for (const ClassInfoDef &c : std::as_const(cdef->classInfoList)) {
        strreg(c.name);
        strreg(c.value);
    }
}